

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O3

QUrl __thiscall QTextBrowserPrivate::resolveUrl(QTextBrowserPrivate *this,QUrl *url)

{
  char cVar1;
  char cVar2;
  QUrl *in_RDX;
  long in_FS_OFFSET;
  bool bVar3;
  QStringView QVar4;
  QLatin1String QVar5;
  QFileInfo fi;
  QArrayData *local_d8;
  QString local_b8;
  QUrl local_a0;
  undefined1 *local_98;
  QArrayData *local_90 [3];
  QFileInfo local_78 [8];
  QArrayData *local_70;
  storage_type_conflict *local_68;
  long local_60;
  QStringBuilder<QString,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QUrl::isRelative();
  if (cVar1 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QUrl::QUrl((QUrl *)this,in_RDX);
      return (QUrl)(QUrlPrivate *)this;
    }
    goto LAB_004a5a37;
  }
  cVar1 = QUrl::isRelative();
  if (cVar1 == '\0') {
    QUrl::scheme();
    bVar3 = true;
    if ((local_60 == 4) &&
       (QVar4.m_data = local_68, QVar4.m_size = 4, QVar5.m_data = "file", QVar5.m_size = 4,
       cVar2 = QtPrivate::equalStrings(QVar4,QVar5), cVar2 != '\0')) {
      QUrl::toLocalFile();
      QFileInfo::QFileInfo(local_78,(QString *)local_90);
      cVar2 = QFileInfo::isRelative();
      bVar3 = true;
      if (cVar2 != '\0') {
        cVar2 = QUrl::hasFragment();
        if (cVar2 != '\0') goto LAB_004a5740;
        bVar3 = false;
      }
LAB_004a5991:
      QFileInfo::~QFileInfo(local_78);
      if (local_90[0] != (QArrayData *)0x0) {
        LOCK();
        (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_90[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_90[0],2,0x10);
        }
      }
    }
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
    if (!bVar3) goto LAB_004a579b;
LAB_004a59ea:
    QUrl::resolved((QUrl *)this);
  }
  else {
    cVar2 = QUrl::hasFragment();
    if (cVar2 != '\0') {
LAB_004a5740:
      QUrl::path(&local_58);
      bVar3 = local_58.a.d.size == 0;
      if (&(local_58.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (cVar1 == '\0') goto LAB_004a5991;
      if (local_58.a.d.size == 0) goto LAB_004a59ea;
    }
LAB_004a579b:
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    QUrl::toLocalFile();
    QFileInfo::QFileInfo((QFileInfo *)&local_98,(QString *)&local_58);
    if (&(local_58.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    cVar1 = QFileInfo::exists();
    if (cVar1 == '\0') {
      QUrl::QUrl((QUrl *)this,in_RDX);
    }
    else {
      QFileInfo::absolutePath();
      local_58.a.d.d = (Data *)local_d8;
      local_58.b.ucs = L'/';
      QStringBuilder<QString,_QChar>::convertTo<QString>(&local_b8,&local_58);
      QUrl::fromLocalFile((QString *)&local_a0);
      QUrl::resolved((QUrl *)this);
      QUrl::~QUrl(&local_a0);
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_58.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.a.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QFileInfo::~QFileInfo((QFileInfo *)&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QUrl)(QUrlPrivate *)this;
  }
LAB_004a5a37:
  __stack_chk_fail();
}

Assistant:

QUrl QTextBrowserPrivate::resolveUrl(const QUrl &url) const
{
    if (!url.isRelative())
        return url;

    // For the second case QUrl can merge "#someanchor" with "foo.html"
    // correctly to "foo.html#someanchor"
    if (!(currentURL.isRelative()
          || (currentURL.scheme() == "file"_L1
              && !QFileInfo(currentURL.toLocalFile()).isAbsolute()))
          || (url.hasFragment() && url.path().isEmpty())) {
        return currentURL.resolved(url);
    }

    // this is our last resort when current url and new url are both relative
    // we try to resolve against the current working directory in the local
    // file system.
    QFileInfo fi(currentURL.toLocalFile());
    if (fi.exists()) {
        return QUrl::fromLocalFile(fi.absolutePath() + QDir::separator()).resolved(url);
    }

    return url;
}